

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights_test.cpp
# Opt level: O2

void __thiscall LightBounds_Basics_Test::TestBody(LightBounds_Basics_Test *this)

{
  char *pcVar1;
  Float FVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar7 [56];
  undefined1 auVar6 [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Vector3<float> VVar10;
  Point3f PVar11;
  Tuple3<pbrt::Vector3,_float> local_138;
  AssertionResult gtest_ar_2;
  AssertHelper local_118;
  Float local_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  AssertionResult gtest_ar;
  Interval local_a8;
  Interval IStack_a0;
  Interval local_98;
  Float local_90;
  Tuple3<pbrt::Vector3,_float> local_8c;
  undefined1 *local_80;
  bool local_78;
  undefined1 local_70 [24];
  undefined1 local_58 [32];
  float local_38;
  undefined1 local_30 [16];
  
  auVar3._8_4_ = 0x3dcccccd;
  auVar3._0_8_ = 0x3dcccccd3dcccccd;
  auVar3._12_4_ = 0x3dcccccd;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
  gtest_ar_2._0_8_ = vmovlps_avx(auVar3);
  gtest_ar_2.message_.ptr_._0_4_ = 0x3c23d70a;
  pbrt::Bounds3<float>::Bounds3
            ((Bounds3<float> *)local_70,(Point3<float> *)&gtest_ar,(Point3<float> *)&gtest_ar_2);
  auVar7 = ZEXT856((ulong)local_70._8_8_);
  local_138.x = 0.0;
  local_138.y = 0.0;
  local_138.z = 1.0;
  local_98.low = (Float)local_70._16_4_;
  local_98.high = (Float)local_70._20_4_;
  local_a8.low = (Float)local_70._0_4_;
  local_a8.high = (Float)local_70._4_4_;
  IStack_a0.low = (Float)local_70._8_4_;
  IStack_a0.high = (Float)local_70._12_4_;
  local_90 = 1.0;
  VVar10 = pbrt::Normalize<float>((Vector3<float> *)&local_138);
  local_8c.z = VVar10.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar6._0_8_ = VVar10.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar6._8_56_ = auVar7;
  local_8c._0_8_ = vmovlps_avx(auVar6._0_16_);
  auVar8._8_4_ = 0x3f800000;
  auVar8._0_8_ = 0x3f8000003f800000;
  auVar8._12_4_ = 0x3f800000;
  local_80 = &DAT_b33bbd2e3f800000;
  local_78 = false;
  local_70._0_4_ = 1.0;
  local_70._4_4_ = 1.0;
  local_70._8_4_ = 1.0;
  local_70._12_4_ = 1.0;
  local_70._16_8_ = vmovlps_avx(auVar8);
  local_38 = 0.0;
  local_108 = 1.0;
  fStack_104 = 1.0;
  fStack_100 = 1.0;
  fStack_fc = 1.0;
  local_58 = ZEXT832(0) << 0x20;
  local_30 = ZEXT416(0) << 0x20;
  PVar11 = pbrt::Interaction::p((Interaction *)local_70);
  FVar2 = pbrt::LightBounds::Importance((LightBounds *)&local_a8,PVar11,(Normal3f)local_58._16_12_);
  local_138._0_8_ = local_138._0_8_ & 0xffffffff00000000;
  gtest_ar_2._0_4_ = FVar2;
  testing::internal::CmpHelperGT<float,int>
            ((internal *)&gtest_ar,"bounds.Importance(intr.p(), intr.n)","0",(float *)&gtest_ar_2,
             (int *)&local_138);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights_test.cpp"
               ,0xb9,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_138,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  auVar4._8_4_ = 0xbf800000;
  auVar4._0_8_ = 0xbf800000bf800000;
  auVar4._12_4_ = 0xbf800000;
  local_70._0_4_ = 1.0;
  local_70._4_4_ = 1.0;
  local_70._8_4_ = 1.0;
  local_70._12_4_ = 1.0;
  local_70._16_8_ = vmovlps_avx(auVar4);
  local_38 = 0.0;
  local_58._0_16_ = ZEXT816(0);
  local_58 = ZEXT1632(local_58._0_16_);
  local_30 = ZEXT416(0) << 0x40;
  PVar11 = pbrt::Interaction::p((Interaction *)local_70);
  FVar2 = pbrt::LightBounds::Importance((LightBounds *)&local_a8,PVar11,(Normal3f)local_58._16_12_);
  local_138._0_8_ = local_138._0_8_ & 0xffffffff00000000;
  gtest_ar_2._0_4_ = FVar2;
  testing::internal::CmpHelperEQ<float,int>
            ((internal *)&gtest_ar,"bounds.Importance(intr.p(), intr.n)","0",(float *)&gtest_ar_2,
             (int *)&local_138);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights_test.cpp"
               ,0xbf,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_138,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_70._4_4_ = fStack_104;
  local_70._0_4_ = local_108;
  local_70._12_4_ = fStack_fc;
  local_70._8_4_ = fStack_100;
  auVar5._8_4_ = 0x3f800000;
  auVar5._0_8_ = 0x3f8000003f800000;
  auVar5._12_4_ = 0x3f800000;
  local_70._16_8_ = vmovlps_avx(auVar5);
  local_38 = 0.0;
  local_58._0_16_ = ZEXT816(0);
  local_58 = ZEXT1632(local_58._0_16_);
  local_30 = ZEXT416(0) << 0x40;
  PVar11 = pbrt::Interaction::p((Interaction *)local_70);
  local_10c = pbrt::LightBounds::Importance
                        ((LightBounds *)&local_a8,PVar11,(Normal3f)local_58._16_12_);
  auVar9._8_4_ = 0x3ca3d70a;
  auVar9._0_8_ = 0x3ca3d70a3ca3d70a;
  auVar9._12_4_ = 0x3ca3d70a;
  gtest_ar._4_4_ = fStack_104;
  gtest_ar._0_4_ = local_108;
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       CONCAT44(fStack_fc,fStack_100);
  vmovlps_avx(auVar9);
  PVar11 = pbrt::Interaction::p((Interaction *)&gtest_ar);
  FVar2 = pbrt::LightBounds::Importance((LightBounds *)&local_a8,PVar11,(Normal3f)0x0);
  local_118.data_._0_4_ = FVar2 / local_10c;
  local_138.x = -1.5881868e-23;
  local_138.y = 1.5749999;
  testing::internal::CmpHelperLT<float,double>
            ((internal *)&gtest_ar_2,"impLow / impHigh",".2",(float *)&local_118,
             (double *)&local_138);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_138);
    if ((undefined8 *)CONCAT44(gtest_ar_2.message_.ptr_._4_4_,gtest_ar_2.message_.ptr_._0_4_) ==
        (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)CONCAT44(gtest_ar_2.message_.ptr_._4_4_,gtest_ar_2.message_.ptr_._0_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights_test.cpp"
               ,0xcc,pcVar1);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_138);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  return;
}

Assistant:

TEST(LightBounds, Basics) {
    LightBounds bounds(Bounds3f(Point3f(0, 0, 0), Point3f(.1, .1, .01)),
                       Vector3f(0, 0, 1), 1.f /* phi */, std::cos(0.f) /* theta_o: normal spread */,
                       std::cos(Pi / 2) /* theta_e: falloff given visible normal */,
                       false /* two-sided */);

    // Positive importance for point on the emissive side
    {
        Interaction intr(Point3f(1, 1, 1), 0.f /* time */, (MediumInterface *)nullptr);
        EXPECT_GT(bounds.Importance(intr.p(), intr.n), 0);
    }

    // Zero importance for point on the non-emissive side
    {
        Interaction intr(Point3f(1, 1, -1), 0.f /* time */, (MediumInterface *)nullptr);
        EXPECT_EQ(bounds.Importance(intr.p(), intr.n), 0);
    }

    // Low importance when close to the emitter's plane (since cos theta)
    {
        Interaction intrHigh(Point3f(1, 1, 1), 0.f /* time */,
                             (MediumInterface *)nullptr);
        Float impHigh = bounds.Importance(intrHigh.p(), intrHigh.n);

        Interaction intrLow(Point3f(1, 1, .02), 0.f /* time */,
                            (MediumInterface *)nullptr);
        Float impLow = bounds.Importance(intrLow.p(), intrLow.n);

        EXPECT_LT(impLow / impHigh, .2);
    }
}